

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O3

Vector<double,_3,_true> *
Nova::Vector<double,_3,_true>::Axis_Vector(Vector<double,_3,_true> *__return_storage_ptr__,int axis)

{
  if ((uint)axis < 3) {
    Vector(__return_storage_ptr__);
    (__return_storage_ptr__->_data)._M_elems[(uint)axis] = 1.0;
    return __return_storage_ptr__;
  }
  __assert_fail("axis>=0 && axis<d",
                "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/include/nova/Tools/Vectors/Vector.h"
                ,0x1df,
                "static Vector<T, d, order_ascending> Nova::Vector<double, 3>::Axis_Vector(const int) [T = double, d = 3, order_ascending = true]"
               );
}

Assistant:

static Vector Axis_Vector(const int axis)
    {
        assert(axis>=0 && axis<d);
        Vector vec;vec(axis)=1;
        return vec;
    }